

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_2U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_2U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint uVar3;
  float *__src;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *__dest;
  uint32_t c;
  uint32_t uVar7;
  uint16_t outValue;
  float outValue_1;
  uint16_t local_4c;
  allocator_type local_49;
  uint local_48;
  uint local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  float local_34;
  
  if (2 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
                 );
  }
  uVar5 = targetBits >> 3;
  local_40 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar5 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_49);
  uVar3 = 0;
  pvVar2 = local_40;
  do {
    if ((this->super_Image).height <= uVar3) {
      return pvVar2;
    }
    local_48 = uVar3;
    for (uVar4 = 0; uVar4 < (this->super_Image).width; uVar4 = uVar4 + 1) {
      local_44 = uVar4;
      for (uVar7 = 0; numChannels != uVar7; uVar7 = uVar7 + 1) {
        uVar6 = (this->super_Image).width * uVar3 + uVar4;
        bVar1 = *(byte *)((long)this->pixels + (((ulong)uVar6 * 2 + 1) - (ulong)(uVar7 == 0)));
        __dest = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start + (uVar6 * numChannels + uVar7) * uVar5;
        if (targetBits == 0x20) {
          local_34 = (float)bVar1;
          __src = &local_34;
LAB_0017ee71:
          memcpy(__dest,__src,(ulong)uVar5);
          pvVar2 = local_40;
          uVar3 = local_48;
          uVar4 = local_44;
        }
        else {
          if (targetBits == 0x10) {
            local_4c = imageio::float_to_half((float)bVar1);
            __src = (float *)&local_4c;
            goto LAB_0017ee71;
          }
          if (targetBits == 8) {
            *__dest = bVar1;
          }
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }